

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O2

void __thiscall
soplex::DSVectorBase<double>::DSVectorBase<double>
          (DSVectorBase<double> *this,SVectorBase<double> *old)

{
  (this->super_SVectorBase<double>).m_elem = (Nonzero<double> *)0x0;
  (this->super_SVectorBase<double>).memsize = 0;
  (this->super_SVectorBase<double>).memused = 0;
  this->_vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003326e8;
  this->theelem = (Nonzero<double> *)0x0;
  allocMem(this,old->memused);
  SVectorBase<double>::operator=(&this->super_SVectorBase<double>,old);
  return;
}

Assistant:

explicit DSVectorBase(const SVectorBase<S>& old)
      : theelem(nullptr)
   {
      allocMem(old.size());
      SVectorBase<R>::operator=(old);

      assert(isConsistent());
   }